

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool glcts::PipelineStatisticsQueryUtilities::executeQuery
               (GLenum query_type,GLuint qo_id,GLuint qo_bo_id,PFNQUERYDRAWHANDLERPROC pfn_draw,
               void *draw_user_arg,RenderContext *render_context,TestContext *test_context,
               ContextInfo *context_info,_test_execution_result *out_result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  GLenum value;
  GLenum value_00;
  MessageBuilder local_1308;
  MessageBuilder local_1188;
  uchar *local_1008;
  uchar *bo_data_ptr;
  MessageBuilder local_e80;
  deUint32 local_d00;
  ContextType local_cfc;
  MessageBuilder local_cf8;
  MessageBuilder local_b78;
  deUint32 local_9f8;
  ContextType local_9f4;
  MessageBuilder local_9f0;
  byte local_869;
  GLuint64 GStack_868;
  bool result_uint64_written;
  GLuint64 result_uint64;
  GLuint result_uint;
  bool result_int64_written;
  GLint64 result_int64;
  undefined1 *puStack_848;
  GLint result_int;
  GLuint64 *offset_uint64;
  GLuint *offset_uint;
  GLint64 *offset_int64;
  GLint *offset_int;
  undefined4 local_820;
  uint n_iteration;
  uint iteration_index_with_qo_bo;
  uint iteration_index_wo_qo_bo;
  MessageBuilder local_698;
  MessageBuilder local_518;
  string local_398;
  MessageBuilder local_378;
  string local_1f8;
  MessageBuilder local_1c8;
  int local_48;
  byte local_41;
  GLint n_query_bits;
  bool result;
  Functions *gl;
  RenderContext *pRStack_30;
  GLenum error_code;
  RenderContext *render_context_local;
  void *draw_user_arg_local;
  PFNQUERYDRAWHANDLERPROC pfn_draw_local;
  GLuint qo_bo_id_local;
  GLuint qo_id_local;
  GLenum query_type_local;
  
  gl._4_4_ = 0;
  pRStack_30 = render_context;
  render_context_local = (RenderContext *)draw_user_arg;
  draw_user_arg_local = pfn_draw;
  pfn_draw_local._0_4_ = qo_bo_id;
  pfn_draw_local._4_4_ = qo_id;
  qo_bo_id_local = query_type;
  iVar2 = (*render_context->_vptr_RenderContext[3])();
  _n_query_bits = CONCAT44(extraout_var,iVar2);
  local_41 = 1;
  local_48 = 0;
  (**(code **)(_n_query_bits + 0xa28))(qo_bo_id_local,0x8864,&local_48);
  gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
  if (gl._4_4_ == 0) {
    if (local_48 == 0) {
      pTVar3 = tcu::TestContext::getLog(test_context);
      tcu::TestLog::operator<<(&local_378,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_378,(char (*) [11])"Skipping [");
      getStringForEnum_abi_cxx11_
                (&local_398,(PipelineStatisticsQueryUtilities *)(ulong)qo_bo_id_local,value_00);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_398);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [43])"]: zero bits available for counter storage");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_398);
      tcu::MessageBuilder::~MessageBuilder(&local_378);
      qo_id_local._3_1_ = (bool)(local_41 & 1);
    }
    else {
      (**(code **)(_n_query_bits + 0x20))(qo_bo_id_local,pfn_draw_local._4_4_);
      gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
      if (gl._4_4_ == 0) {
        bVar1 = glu::ContextInfo::isExtensionSupported(context_info,"GL_ARB_query_buffer_object");
        if ((bVar1) && ((GLuint)pfn_draw_local != 0)) {
          (**(code **)(_n_query_bits + 0x40))(0x9192,(GLuint)pfn_draw_local);
          gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
          if (gl._4_4_ != 0) {
            pTVar3 = tcu::TestContext::getLog(test_context);
            tcu::TestLog::operator<<(&local_698,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_698,
                                (char (*) [96])
                                "Could not bind a buffer object to GL_QUERY_BUFFER buffer object binding point. Error reported:["
                               );
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_698);
            (**(code **)(_n_query_bits + 0x628))(qo_bo_id_local);
            return false;
          }
          gl._4_4_ = 0;
        }
        else {
          pfn_draw_local._0_4_ = 0;
        }
        if (draw_user_arg_local != (void *)0x0) {
          (*(code *)draw_user_arg_local)(render_context_local);
        }
        (**(code **)(_n_query_bits + 0x628))(qo_bo_id_local);
        gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
        if (gl._4_4_ == 0) {
          n_iteration = 0;
          local_820 = 1;
          for (offset_int._4_4_ = 0; gl._4_4_ = 0, offset_int._4_4_ < 2;
              offset_int._4_4_ = offset_int._4_4_ + 1) {
            result_int64._4_4_ = 0x7fffffff;
            _result_uint = 0x7fffffffffffffff;
            result_uint64._7_1_ = 0;
            result_uint64._0_4_ = 0xffffffff;
            GStack_868 = 0xffffffffffffffff;
            local_869 = 0;
            if ((offset_int._4_4_ != 1) || ((GLuint)pfn_draw_local != 0)) {
              if (offset_int._4_4_ == 0) {
                offset_int64 = (GLint64 *)((long)&result_int64 + 4);
                offset_uint = &result_uint;
                offset_uint64 = &result_uint64;
                puStack_848 = (undefined1 *)&stack0xfffffffffffff798;
              }
              else {
                offset_int64 = (GLint64 *)0x0;
                offset_uint = (GLuint *)0x8;
                offset_uint64 = (GLuint64 *)0x10;
                puStack_848 = (undefined1 *)0x18;
              }
              if (offset_int._4_4_ == 1) {
                (**(code **)(_n_query_bits + 0x40))(0x9192,(GLuint)pfn_draw_local);
              }
              else {
                (**(code **)(_n_query_bits + 0x40))(0x9192,0);
              }
              gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
              if (gl._4_4_ != 0) {
                pTVar3 = tcu::TestContext::getLog(test_context);
                tcu::TestLog::operator<<
                          (&local_9f0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar4 = tcu::MessageBuilder::operator<<
                                   (&local_9f0,
                                    (char (*) [67])
                                    "glBindBuffer() call failed for GL_QUERY_BUFFER target with error ["
                                   );
                pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_9f0);
                return false;
              }
              local_9f4.super_ApiType.m_bits = (ApiType)(*pRStack_30->_vptr_RenderContext[2])();
              local_9f8 = (deUint32)glu::ApiType::core(3,3);
              bVar1 = glu::contextSupports(local_9f4,(ApiType)local_9f8);
              if (bVar1) {
                (**(code **)(_n_query_bits + 0xa08))(pfn_draw_local._4_4_,0x8866,offset_uint);
                gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
                if (gl._4_4_ != 0) {
                  pTVar3 = tcu::TestContext::getLog(test_context);
                  tcu::TestLog::operator<<
                            (&local_b78,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar4 = tcu::MessageBuilder::operator<<
                                     (&local_b78,
                                      (char (*) [48])
                                      "glGetQueryObjecti64v() call failed with error [");
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                  tcu::MessageBuilder::operator<<
                            (pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_b78);
                  return false;
                }
                result_uint64._7_1_ = 1;
                gl._4_4_ = 0;
              }
              else {
                result_uint64._7_1_ = 0;
              }
              (**(code **)(_n_query_bits + 0xa10))(pfn_draw_local._4_4_,0x8866,offset_int64);
              gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
              if (gl._4_4_ != 0) {
                pTVar3 = tcu::TestContext::getLog(test_context);
                tcu::TestLog::operator<<
                          (&local_cf8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar4 = tcu::MessageBuilder::operator<<
                                   (&local_cf8,
                                    (char (*) [46])"glGetQueryObjectiv() call failed with error [");
                pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_cf8);
                return false;
              }
              local_cfc.super_ApiType.m_bits = (ApiType)(*pRStack_30->_vptr_RenderContext[2])();
              local_d00 = (deUint32)glu::ApiType::core(3,3);
              bVar1 = glu::contextSupports(local_cfc,(ApiType)local_d00);
              if (bVar1) {
                (**(code **)(_n_query_bits + 0xa18))(pfn_draw_local._4_4_,0x8866,puStack_848);
                gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
                if (gl._4_4_ != 0) {
                  pTVar3 = tcu::TestContext::getLog(test_context);
                  tcu::TestLog::operator<<
                            (&local_e80,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar4 = tcu::MessageBuilder::operator<<
                                     (&local_e80,
                                      (char (*) [49])
                                      "glGetQueryObjectui64v() call failed with error [");
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                  tcu::MessageBuilder::operator<<
                            (pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_e80);
                  return false;
                }
                local_869 = 1;
                gl._4_4_ = 0;
              }
              else {
                local_869 = 0;
              }
              (**(code **)(_n_query_bits + 0xa20))(pfn_draw_local._4_4_,0x8866,offset_uint64);
              gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
              if (gl._4_4_ != 0) {
                pTVar3 = tcu::TestContext::getLog(test_context);
                tcu::TestLog::operator<<
                          ((MessageBuilder *)&bo_data_ptr,pTVar3,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar4 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)&bo_data_ptr,
                                    (char (*) [47])"glGetQueryObjectuiv() call failed with error [")
                ;
                pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&bo_data_ptr);
                return false;
              }
              if (offset_int._4_4_ == 1) {
                local_1008 = (uchar *)(**(code **)(_n_query_bits + 0xcf8))(0x9192);
                gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
                if ((gl._4_4_ != 0) || (local_1008 == (uchar *)0x0)) {
                  pTVar3 = tcu::TestContext::getLog(test_context);
                  tcu::TestLog::operator<<
                            (&local_1188,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar4 = tcu::MessageBuilder::operator<<
                                     (&local_1188,(char (*) [34])"QO BO mapping failed with error ["
                                     );
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                  pMVar4 = tcu::MessageBuilder::operator<<
                                     (pMVar4,(char (*) [26])"] and data ptr returned:[");
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1008);
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                  tcu::MessageBuilder::operator<<
                            (pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_1188);
                  return false;
                }
                result_int64._4_4_ = *(GLint *)(local_1008 + (int)offset_int64);
                _result_uint = *(GLint64 *)(local_1008 + (int)offset_uint);
                result_uint64._0_4_ = *(GLuint *)(local_1008 + (int)offset_uint64);
                GStack_868 = *(GLuint64 *)(local_1008 + (int)puStack_848);
                (**(code **)(_n_query_bits + 0x1670))(0x9192);
                gl._4_4_ = (**(code **)(_n_query_bits + 0x800))();
                if (gl._4_4_ != 0) {
                  pTVar3 = tcu::TestContext::getLog(test_context);
                  tcu::TestLog::operator<<
                            (&local_1308,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar4 = tcu::MessageBuilder::operator<<
                                     (&local_1308,
                                      (char (*) [36])"QO BO unmapping failed with error [");
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
                  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
                  tcu::MessageBuilder::operator<<
                            (pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_1308);
                  return false;
                }
              }
              if (offset_int._4_4_ == 1) {
                out_result->result_qo_int = result_int64._4_4_;
                out_result->result_qo_int64 = _result_uint;
                out_result->result_qo_uint = (GLuint)result_uint64;
                out_result->result_qo_uint64 = GStack_868;
              }
              else {
                out_result->result_int = result_int64._4_4_;
                out_result->result_int64 = _result_uint;
                out_result->result_uint = (GLuint)result_uint64;
                out_result->result_uint64 = GStack_868;
              }
              out_result->int64_written = (bool)(result_uint64._7_1_ & 1);
              out_result->uint64_written = (bool)(local_869 & 1);
            }
          }
          qo_id_local._3_1_ = (bool)(local_41 & 1);
        }
        else {
          pTVar3 = tcu::TestContext::getLog(test_context);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&iteration_index_with_qo_bo,pTVar3,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&iteration_index_with_qo_bo,
                              (char (*) [42])"glEndQuery() call failed with error code[");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&iteration_index_with_qo_bo);
          qo_id_local._3_1_ = false;
        }
      }
      else {
        pTVar3 = tcu::TestContext::getLog(test_context);
        tcu::TestLog::operator<<(&local_518,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_518,
                            (char (*) [65])
                            "A valid glBeginQuery() call generated the following error code:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&gl + 4));
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_518);
        qo_id_local._3_1_ = false;
      }
    }
  }
  else {
    pTVar3 = tcu::TestContext::getLog(test_context);
    tcu::TestLog::operator<<(&local_1c8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1c8,
                        (char (*) [64])
                        "glGetQueryiv() call failed for GL_QUERY_COUNTER_BITS pname and ");
    getStringForEnum_abi_cxx11_
              (&local_1f8,(PipelineStatisticsQueryUtilities *)(ulong)qo_bo_id_local,value);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])"query target.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_1f8);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    qo_id_local._3_1_ = false;
  }
  return qo_id_local._3_1_;
}

Assistant:

bool PipelineStatisticsQueryUtilities::executeQuery(glw::GLenum query_type, glw::GLuint qo_id, glw::GLuint qo_bo_id,
													PFNQUERYDRAWHANDLERPROC pfn_draw, void* draw_user_arg,
													const glu::RenderContext& render_context,
													tcu::TestContext&		  test_context,
													const glu::ContextInfo&   context_info,
													_test_execution_result*   out_result)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = render_context.getFunctions();
	bool				  result	 = true;

	/* Check if the implementation provides non-zero number of bits for the query.
	 * Queries, for which GL implementations provide zero bits of space return
	 * indeterminate values, so we should skip them */
	glw::GLint n_query_bits = 0;

	gl.getQueryiv(query_type, GL_QUERY_COUNTER_BITS, &n_query_bits);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message
							  << "glGetQueryiv() call failed for GL_QUERY_COUNTER_BITS pname and "
							  << PipelineStatisticsQueryUtilities::getStringForEnum(query_type) << "query target."
							  << tcu::TestLog::EndMessage;

		return false;
	}

	if (n_query_bits == 0)
	{
		test_context.getLog() << tcu::TestLog::Message << "Skipping "
														  "["
							  << PipelineStatisticsQueryUtilities::getStringForEnum(query_type)
							  << "]"
								 ": zero bits available for counter storage"
							  << tcu::TestLog::EndMessage;

		return result;
	}

	/* Start the query */
	gl.beginQuery(query_type, qo_id);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message
							  << "A valid glBeginQuery() call generated the following error code:"
								 "["
							  << error_code << "]" << tcu::TestLog::EndMessage;

		return false;
	}

	/* If GL_ARB_query_buffer_object is supported and the caller supplied a BO id, use
	 * it before we fire any draw calls */
	if (context_info.isExtensionSupported("GL_ARB_query_buffer_object") && qo_bo_id != 0)
	{
		gl.bindBuffer(GL_QUERY_BUFFER, qo_bo_id);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message
								  << "Could not bind a buffer object to GL_QUERY_BUFFER buffer object "
									 "binding point. Error reported:"
									 "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			/* Stop the query before we leave */
			gl.endQuery(query_type);

			return false;
		} /* if (buffer binding operation failed) */
	}	 /* if (GL_ARB_query_buffer_object extension is supported and the supplied QO BO id
	 *     is not 0) */
	else
	{
		/* Reset the QO BO id, so that we can skip the checks later */
		qo_bo_id = 0;
	}

	/* Perform the draw calls, if any supplied call-back function pointer was supplied
	 * by the caller. */
	if (pfn_draw != DE_NULL)
	{
		pfn_draw(draw_user_arg);
	}

	/* End the query */
	gl.endQuery(query_type);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message << "glEndQuery() call failed with error code"
														  "["
							  << error_code << "]" << tcu::TestLog::EndMessage;

		return false;
	} /* if (glEndQuery() call failed) */

	/* We now need to retrieve the result data using all query getter functions
	 * GL has to offer. This will be handled in two iterations:
	 *
	 * 1. The data will be retrieved using the getters without a QO BO being bound.
	 * 2. If QO was provided, we will need to issue all getter calls executed against
	 *    the QO BO. We will then need to retrieve that data directly from the BO
	 *    storage.
	 */
	const unsigned int iteration_index_wo_qo_bo   = 0;
	const unsigned int iteration_index_with_qo_bo = 1;

	for (unsigned int n_iteration = 0; n_iteration < 2; /* as per description */
		 ++n_iteration)
	{
		glw::GLint*	offset_int			 = DE_NULL;
		glw::GLint64*  offset_int64			 = DE_NULL;
		glw::GLuint*   offset_uint			 = DE_NULL;
		glw::GLuint64* offset_uint64		 = DE_NULL;
		glw::GLint	 result_int			 = INT_MAX;
		glw::GLint64   result_int64			 = LLONG_MAX;
		bool		   result_int64_written  = false;
		glw::GLuint	result_uint			 = UINT_MAX;
		glw::GLuint64  result_uint64		 = ULLONG_MAX;
		bool		   result_uint64_written = false;

		/* Skip the QO BO iteration if QO BO id has not been provided */
		if (n_iteration == iteration_index_with_qo_bo && qo_bo_id == 0)
		{
			continue;
		}

		/* Determine the offsets we should use for the getter calls */
		if (n_iteration == iteration_index_wo_qo_bo)
		{
			offset_int	= &result_int;
			offset_int64  = &result_int64;
			offset_uint   = &result_uint;
			offset_uint64 = &result_uint64;
		}
		else
		{
			offset_int	= (glw::GLint*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_int_offset;
			offset_int64  = (glw::GLint64*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_int64_offset;
			offset_uint   = (glw::GLuint*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_uint_offset;
			offset_uint64 = (glw::GLuint64*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_uint64_offset;
		}

		/* Bind the QO BO if we need to use it for the getter calls */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			gl.bindBuffer(GL_QUERY_BUFFER, qo_bo_id);
		}
		else
		{
			gl.bindBuffer(GL_QUERY_BUFFER, 0 /* buffer */);
		}

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message
								  << "glBindBuffer() call failed for GL_QUERY_BUFFER target with error "
									 "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		/* Issue the getter calls.
		 *
		 * NOTE: 64-bit getter calls are supported only if >= GL 3.3*/
		if (glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 3)))
		{
			gl.getQueryObjecti64v(qo_id, GL_QUERY_RESULT, offset_int64);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjecti64v() call failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			result_int64_written = true;
		}
		else
		{
			result_int64_written = false;
		}

		gl.getQueryObjectiv(qo_id, GL_QUERY_RESULT, offset_int);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectiv() call failed with error "
															  "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		if (glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 3)))
		{
			gl.getQueryObjectui64v(qo_id, GL_QUERY_RESULT, offset_uint64);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectui64v() call failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			result_uint64_written = true;
		}
		else
		{
			result_uint64_written = false;
		}

		gl.getQueryObjectuiv(qo_id, GL_QUERY_RESULT, offset_uint);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectuiv() call failed with error "
															  "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		/* If the getters wrote the result values to the BO, we need to retrieve the data
		 * from the BO storage */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			/* Map the BO to process space */
			const unsigned char* bo_data_ptr = (const unsigned char*)gl.mapBuffer(GL_QUERY_BUFFER, GL_READ_ONLY);

			error_code = gl.getError();

			if (error_code != GL_NO_ERROR || bo_data_ptr == NULL)
			{
				test_context.getLog() << tcu::TestLog::Message << "QO BO mapping failed with error "
																  "["
									  << error_code << "] and data ptr returned:"
													   "["
									  << bo_data_ptr << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			/* Retrieve the query result data */
			result_int	= *(glw::GLint*)(bo_data_ptr + (int)(deIntptr)offset_int);
			result_int64  = *(glw::GLint64*)(bo_data_ptr + (int)(deIntptr)offset_int64);
			result_uint   = *(glw::GLuint*)(bo_data_ptr + (int)(deIntptr)offset_uint);
			result_uint64 = *(glw::GLuint64*)(bo_data_ptr + (int)(deIntptr)offset_uint64);

			/* Unmap the BO */
			gl.unmapBuffer(GL_QUERY_BUFFER);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "QO BO unmapping failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}
		} /* if (QO BO iteration) */

		/* Store the retrieved data in user-provided location */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			out_result->result_qo_int	= result_int;
			out_result->result_qo_int64  = result_int64;
			out_result->result_qo_uint   = result_uint;
			out_result->result_qo_uint64 = result_uint64;
		}
		else
		{
			out_result->result_int	= result_int;
			out_result->result_int64  = result_int64;
			out_result->result_uint   = result_uint;
			out_result->result_uint64 = result_uint64;
		}

		out_result->int64_written  = result_int64_written;
		out_result->uint64_written = result_uint64_written;
	} /* for (both iterations) */
	return result;
}